

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer_sink.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
spdlog::sinks::ringbuffer_sink<std::mutex>::last_formatted_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ringbuffer_sink<std::mutex> *this,size_t lim)

{
  mutex *__mutex;
  size_type *psVar1;
  ulong uVar2;
  formatter *pfVar3;
  int iVar4;
  size_t sVar5;
  ulong __n;
  long lVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  memory_buf_t formatted;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined **local_150;
  undefined1 *local_148;
  long local_140;
  ulong local_138;
  undefined1 local_130 [256];
  
  __mutex = &(this->super_base_sink<std::mutex>).mutex_;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    uVar2 = (this->q_).tail_;
    psVar1 = &(this->q_).head_;
    if (uVar2 < *psVar1) {
      sVar5 = (this->q_).max_items_;
    }
    else {
      sVar5 = 0;
    }
    uVar2 = sVar5 + (uVar2 - *psVar1);
    __n = lim;
    if (uVar2 < lim) {
      __n = uVar2;
    }
    if (lim == 0) {
      __n = uVar2;
    }
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,__n);
    if (uVar2 - __n < uVar2) {
      lVar6 = -__n;
      do {
        local_140 = 0;
        local_150 = &PTR_grow_00329538;
        local_138 = 0xfa;
        pfVar3 = (this->super_base_sink<std::mutex>).formatter_._M_t.
                 super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>
                 .super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
        local_148 = local_130;
        (*pfVar3->_vptr_formatter[2])
                  (pfVar3,(this->q_).v_.
                          super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          (lVar6 + uVar2 + (this->q_).head_) % (this->q_).max_items_,&local_150);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,local_148,local_148 + local_140);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if (local_148 != local_130) {
          operator_delete(local_148,local_138);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

std::vector<std::string> last_formatted(size_t lim = 0)
    {
        std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
        auto items_available = q_.size();
        auto n_items = lim > 0 ? (std::min)(lim, items_available) : items_available;
        std::vector<std::string> ret;
        ret.reserve(n_items);
        for (size_t i = (items_available - n_items); i < items_available; i++)
        {
            memory_buf_t formatted;
            base_sink<Mutex>::formatter_->format(q_.at(i), formatted);
            ret.push_back(fmt::to_string(formatted));
        }
        return ret;
    }